

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall Parsing::File::createFile(File *this)

{
  bool bVar1;
  undefined1 local_218 [8];
  ofstream f;
  File *this_local;
  
  bVar1 = isFile(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::ofstream::ofstream(local_218,(string *)&this->_path,_S_out);
    std::ofstream::close();
    this_local._7_1_ = isFile(this);
    std::ofstream::~ofstream(local_218);
  }
  return this_local._7_1_;
}

Assistant:

bool File::createFile() const noexcept
    {
        if (isFile())
            return false;

        std::ofstream f(_path);
        f.close();

        if (!isFile())
            return false;

        return true;
    }